

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

Text __thiscall loguru::vtextprintf(loguru *this,char *format,__va_list_tag *vlist)

{
  int iVar1;
  char *buff;
  char *local_18;
  
  local_18 = (char *)0x0;
  iVar1 = vasprintf(&local_18,format,vlist);
  if (-1 < iVar1) {
    *(char **)this = local_18;
    return (Text)(char *)this;
  }
  vtextprintf();
}

Assistant:

static Text vtextprintf(const char* format, va_list vlist)
	{
#ifdef _WIN32
		int bytes_needed = _vscprintf(format, vlist);
		CHECK_F(bytes_needed >= 0, "Bad string format: '%s'", format);
		char* buff = (char*)malloc(bytes_needed+1);
		vsnprintf(buff, bytes_needed+1, format, vlist);
		return Text(buff);
#else
		char* buff = nullptr;
		int result = vasprintf(&buff, format, vlist);
		CHECK_F(result >= 0, "Bad string format: '" LOGURU_FMT(s) "'", format);
		return Text(buff);
#endif
	}